

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>::
SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *this,
          vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
          *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          char batchSize,InnerRegisterSupplier *registerSupplier)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  CountingStorageItemRegister<supermap::KeyValue<char,_char>,_char,_void> *pCVar5;
  KeyValue<char,_char> *pKVar6;
  size_type sVar7;
  path *in_RCX;
  shared_ptr<supermap::io::FileManager> *in_RDX;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
  *in_RSI;
  OrderedStorage<supermap::KeyValue<char,_char>,_char,_void> *in_RDI;
  char in_R8B;
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void> *in_R9;
  KeyValue<char,_char> minItem;
  int32_t i_1;
  bool hasMin;
  size_t min;
  anon_class_24_3_5b0b3c05 dropWriteBuffer;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  writeBuffer;
  anon_class_24_3_7a9e0d2b updateOnce;
  size_t i;
  uint64_t totalSize;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  frontLine;
  vector<char,_std::allocator<char>_> currentFrontPointers;
  size_t storagesCount;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
  *in_stack_fffffffffffffdf8;
  path *in_stack_fffffffffffffe00;
  allocator_type *in_stack_fffffffffffffe08;
  anon_class_24_3_5b0b3c05 *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int32_t in_stack_fffffffffffffe1c;
  anon_class_24_3_7a9e0d2b *in_stack_fffffffffffffe20;
  string_type *in_stack_fffffffffffffe28;
  path *in_stack_fffffffffffffe30;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_> *this_00;
  InnerRegisterSupplier *in_stack_fffffffffffffe68;
  int local_150;
  size_type local_148;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_> local_128
  ;
  undefined1 *local_110;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
  *local_108;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  *local_100;
  undefined2 local_f2;
  ulong local_f0;
  long local_e8;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  local_d8;
  allocator<char> local_b9;
  undefined1 local_b8 [24];
  size_type local_a0;
  char local_21;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
  *local_10;
  
  local_21 = in_R8B;
  local_10 = in_RSI;
  std::filesystem::__cxx11::path::path
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (format)((ulong)in_stack_fffffffffffffe20 >> 0x38));
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffe00,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffdf8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
              *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>::SingleFileIndexedStorage
            (in_R9,in_RCX,in_RDX,in_stack_fffffffffffffe68);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
               *)0x192d5e);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x192d6b);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe00);
  Findable<supermap::KeyValue<char,_char>,_char>::Findable
            ((Findable<supermap::KeyValue<char,_char>,_char> *)&in_RDI[1].register_.count_);
  in_RDI->_vptr_OrderedStorage = (_func_int **)&PTR_append_0038b4d0;
  *(undefined **)&in_RDI[1].register_.count_ = &DAT_0038b518;
  local_a0 = std::
             vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
             ::size(local_10);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe20,
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (allocator_type *)in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator(&local_b9);
  std::optional<supermap::KeyValue<char,_char>_>::optional();
  std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>::allocator
            ((allocator<std::optional<supermap::KeyValue<char,_char>_>_> *)0x192e31);
  std::
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  ::vector((vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
            *)in_stack_fffffffffffffe20,
           CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
           (value_type *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>::~allocator
            ((allocator<std::optional<supermap::KeyValue<char,_char>_>_> *)0x192e5c);
  local_e8 = 0;
  for (local_f0 = 0; local_f0 < local_a0; local_f0 = local_f0 + 1) {
    pvVar4 = std::
             vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
             ::operator[](local_10,local_f0);
    iVar3 = (*(pvVar4->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage
              [1])();
    if ('\0' < (char)iVar3) {
      std::
      vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
      ::operator[](&local_d8,local_f0);
      pvVar4 = std::
               vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               ::operator[](local_10,local_f0);
      iVar3 = (*(pvVar4->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>)
                .super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                _vptr_OrderedStorage[4])(pvVar4,0);
      local_f2 = (undefined2)iVar3;
      std::optional<supermap::KeyValue<char,char>>::emplace<supermap::KeyValue<char,char>>
                ((optional<supermap::KeyValue<char,_char>_> *)in_stack_fffffffffffffe00,
                 (KeyValue<char,_char> *)in_stack_fffffffffffffdf8);
      pvVar4 = std::
               vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               ::operator[](local_10,local_f0);
      iVar3 = (*(pvVar4->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>)
                .super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                _vptr_OrderedStorage[1])();
      local_e8 = (char)iVar3 + local_e8;
    }
  }
  pCVar5 = OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>::getRegister(in_RDI);
  (*(pCVar5->
    super_StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>
    ).
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>_>
    ._vptr_Cloneable[5])(pCVar5,local_e8);
  local_110 = local_b8;
  local_108 = local_10;
  local_100 = &local_d8;
  this_00 = &local_128;
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  vector((vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_> *
         )0x193073);
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  reserve(this_00,(size_type)in_stack_fffffffffffffe28);
  while( true ) {
    local_148 = 0;
    bVar1 = false;
    local_150 = (int)local_a0;
    while (local_150 = local_150 + -1, -1 < local_150) {
      std::
      vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
      ::operator[](&local_d8,(long)local_150);
      bVar2 = std::optional<supermap::KeyValue<char,_char>_>::has_value
                        ((optional<supermap::KeyValue<char,_char>_> *)0x19310c);
      if (bVar2) {
        if (bVar1) {
          std::
          vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
          ::operator[](&local_d8,(long)local_150);
          pKVar6 = std::optional<supermap::KeyValue<char,_char>_>::value
                             ((optional<supermap::KeyValue<char,_char>_> *)in_stack_fffffffffffffe00
                             );
          std::
          vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
          ::operator[](&local_d8,local_148);
          in_stack_fffffffffffffe20 =
               (anon_class_24_3_7a9e0d2b *)
               std::optional<supermap::KeyValue<char,_char>_>::value
                         ((optional<supermap::KeyValue<char,_char>_> *)in_stack_fffffffffffffe00);
          bVar2 = KeyValue<char,_char>::operator<
                            (pKVar6,(KeyValue<char,_char> *)in_stack_fffffffffffffe20);
          in_stack_fffffffffffffe1c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe1c);
          if (bVar2) {
            local_148 = (size_type)local_150;
          }
          else {
            std::
            vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
            ::operator[](&local_d8,(long)local_150);
            in_stack_fffffffffffffe10 =
                 (anon_class_24_3_5b0b3c05 *)
                 std::optional<supermap::KeyValue<char,_char>_>::value
                           ((optional<supermap::KeyValue<char,_char>_> *)in_stack_fffffffffffffe00);
            std::
            vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
            ::operator[](&local_d8,local_148);
            pKVar6 = std::optional<supermap::KeyValue<char,_char>_>::value
                               ((optional<supermap::KeyValue<char,_char>_> *)
                                in_stack_fffffffffffffe00);
            bVar2 = KeyValue<char,_char>::operator==
                              ((KeyValue<char,_char> *)in_stack_fffffffffffffe10,pKVar6);
            if (bVar2) {
              SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
                        (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
            }
          }
        }
        else {
          bVar1 = true;
          local_148 = (size_type)local_150;
        }
      }
    }
    if (!bVar1) break;
    std::
    vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
    ::operator[](&local_d8,local_148);
    in_stack_fffffffffffffe00 =
         (path *)std::optional<supermap::KeyValue<char,_char>_>::value
                           ((optional<supermap::KeyValue<char,_char>_> *)in_stack_fffffffffffffe00);
    SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
    push_back((vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
               *)in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
    sVar7 = std::
            vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
            ::size(&local_128);
    if (local_21 <= (char)sVar7) {
      SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()
                (in_stack_fffffffffffffe10);
    }
  }
  SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(in_stack_fffffffffffffe10);
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  ~vector((vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
           *)in_stack_fffffffffffffe10);
  std::
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  ::~vector((vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
             *)in_stack_fffffffffffffe10);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }